

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O0

RefPtr<wabt::interp::DefinedFunc> * __thiscall
wabt::interp::Store::
Alloc<wabt::interp::DefinedFunc,wabt::interp::Store&,wabt::interp::Ref&,wabt::interp::FuncDesc&>
          (RefPtr<wabt::interp::DefinedFunc> *__return_storage_ptr__,Store *this,Store *args,
          Ref *args_1,FuncDesc *args_2)

{
  DefinedFunc *pDVar1;
  Index index;
  FuncDesc local_c0;
  Ref local_48;
  DefinedFunc *local_40;
  Ref local_38;
  Ref ref;
  FuncDesc *args_local_2;
  Ref *args_local_1;
  Store *args_local;
  Store *this_local;
  RefPtr<wabt::interp::DefinedFunc> *ptr;
  
  ref.index = (size_t)args_2;
  pDVar1 = (DefinedFunc *)operator_new(0x100);
  local_48 = (Ref)args_1->index;
  FuncDesc::FuncDesc(&local_c0,(FuncDesc *)ref.index);
  DefinedFunc::DefinedFunc(pDVar1,args,local_48,&local_c0);
  local_40 = pDVar1;
  index = FreeList<wabt::interp::Object*>::New<wabt::interp::DefinedFunc*>
                    ((FreeList<wabt::interp::Object*> *)&this->objects_,&local_40);
  Ref::Ref(&local_38,index);
  FuncDesc::~FuncDesc(&local_c0);
  RefPtr<wabt::interp::DefinedFunc>::RefPtr(__return_storage_ptr__,this,local_38);
  pDVar1 = RefPtr<wabt::interp::DefinedFunc>::operator->(__return_storage_ptr__);
  (pDVar1->super_Func).super_Extern.super_Object.self_.index = local_38.index;
  return __return_storage_ptr__;
}

Assistant:

RefPtr<T> Store::Alloc(Args&&... args) {
  Ref ref{objects_.New(new T(std::forward<Args>(args)...))};
  RefPtr<T> ptr{*this, ref};
  ptr->self_ = ref;
  return ptr;
}